

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::UnaryExpr<const_entityx::ComponentHandle<Position,_entityx::EntityManager>_&>::UnaryExpr
          (UnaryExpr<const_entityx::ComponentHandle<Position,_entityx::EntityManager>_&> *this,
          ComponentHandle<Position,_entityx::EntityManager> *lhs)

{
  bool bVar1;
  
  bVar1 = entityx::ComponentHandle<Position,_entityx::EntityManager>::valid(lhs);
  (this->super_ITransientExpression).m_isBinaryExpression = false;
  (this->super_ITransientExpression).m_result = bVar1;
  (this->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0020dc20;
  this->m_lhs = lhs;
  return;
}

Assistant:

explicit UnaryExpr( LhsT lhs )
        :   ITransientExpression{ false, static_cast<bool>(lhs) },
            m_lhs( lhs )
        {}